

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Statement> __thiscall Parser::tryCatchStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar3;
  ptr<StatementBlock> tryBlock;
  Identifier identifier;
  undefined1 local_68 [24];
  ptr<StatementBlock> catchBlock;
  
  consume(in_RSI);
  statementBlock((Parser *)&tryBlock);
  consume(in_RSI,Catch,"\'catch\'");
  identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
  identifier._M_string_length = 0;
  identifier.field_2._M_local_buf[0] = '\0';
  bVar2 = match(in_RSI,Identifier);
  if (bVar2) {
    Token::Token((Token *)&catchBlock,&in_RSI->currentToken);
    this_00 = &catchBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    std::__cxx11::string::operator=((string *)&identifier,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    consume(in_RSI);
  }
  statementBlock((Parser *)&catchBlock);
  std::
  make_shared<TryCatchStatement,std::__cxx11::string&,std::shared_ptr<StatementBlock>&,std::shared_ptr<StatementBlock>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (shared_ptr<StatementBlock> *)&identifier,&tryBlock);
  uVar1 = local_68._8_8_;
  local_68._8_8_ = 0;
  (this->filepath)._M_dataplus._M_p = (pointer)local_68._0_8_;
  (this->filepath)._M_string_length = uVar1;
  local_68._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&catchBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&identifier);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tryBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::tryCatchStatement() {
    consume();

    ptr<StatementBlock> tryBlock = statementBlock();
    consume(TokenType::Catch, "'catch'");

    Identifier identifier;
    if(match(TokenType::Identifier)) {
        identifier = token().lexeme;
        consume();
    }

    ptr<StatementBlock> catchBlock = statementBlock();

    return make<TryCatchStatement>(identifier, tryBlock, catchBlock);
}